

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MPP_RET h264e_vepu_mbrc_init(HalH264eVepuMbRcCtx *ctx,HalH264eVepuMbRc *mbrc)

{
  void *pvVar1;
  HalH264eVepuMbRcImpl *p;
  MPP_RET ret;
  HalH264eVepuMbRc *mbrc_local;
  HalH264eVepuMbRcCtx *ctx_local;
  
  p._4_4_ = MPP_OK;
  pvVar1 = mpp_osal_calloc("h264e_vepu_mbrc_init",0x58);
  if (pvVar1 == (void *)0x0) {
    _mpp_log_l(2,"hal_h264e_vepu_v2","failed to alloc rate control context\n","h264e_vepu_mbrc_init"
              );
    p._4_4_ = MPP_ERR_NOMEM;
  }
  memset(mbrc,0,0xc4);
  mbrc->qp_init = -1;
  mbrc->qp_max = 0x30;
  mbrc->qp_min = 0x10;
  *ctx = pvVar1;
  return p._4_4_;
}

Assistant:

MPP_RET h264e_vepu_mbrc_init(HalH264eVepuMbRcCtx *ctx, HalH264eVepuMbRc *mbrc)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepuMbRcImpl *p = mpp_calloc(HalH264eVepuMbRcImpl, 1);
    if (!p) {
        mpp_err_f("failed to alloc rate control context\n");
        ret = MPP_ERR_NOMEM;
    }

    memset(mbrc, 0, sizeof(*mbrc));
    mbrc->qp_init   = -1;
    mbrc->qp_max    = 48;
    mbrc->qp_min    = 16;

    *ctx = p;
    return ret;
}